

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O0

void __thiscall CStructure::deflab(CStructure *this)

{
  int iVar1;
  char local_818;
  char acStack_817 [7];
  char sn [2048];
  size_t moduleNameLength;
  CStructure *this_local;
  
  sn._2040_8_ = strlen(ModuleName);
  memset(&local_818,0,0x800);
  local_818 = '@';
  if (sn._2040_8_ != 0) {
    iVar1 = strncmp(this->id,ModuleName,sn._2040_8_);
    if (((iVar1 == 0) && (this->id[sn._2040_8_] == '.')) && (this->id[sn._2040_8_ + 1] != '\0')) {
      strcpy(&local_818,this->id + sn._2040_8_ + 1);
      goto LAB_00157c1c;
    }
  }
  strcpy(acStack_817,this->id);
LAB_00157c1c:
  InsertSingleStructLabel(true,&local_818,false,this->noffset,true);
  strncat(&local_818,".",0x7ff);
  InsertStructSubLabels(&local_818,false,this->mnf,0,true);
  return;
}

Assistant:

void CStructure::deflab() {
	const size_t moduleNameLength = strlen(ModuleName);
	char sn[LINEMAX] = { '@', 0 };
	if (moduleNameLength && (0 == strncmp(id, ModuleName, moduleNameLength)) \
		&& ('.' == id[moduleNameLength]) && (id[moduleNameLength+1]))
	{
		// looks like the structure name starts with current module name, use non-global way then
		STRCPY(sn, LINEMAX-1, id + moduleNameLength + 1);
	} else {
		// the structure name does not match current module, use the global "@id" way to define it
		STRCPY(sn+1, LINEMAX-1, id);
	}
	InsertSingleStructLabel(true, sn, false, noffset);
	STRCAT(sn, LINEMAX-1, ".");
	InsertStructSubLabels(sn, false, mnf);
}